

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O3

void __thiscall
cmExtraCodeBlocksGenerator::CreateNewProjectFile
          (cmExtraCodeBlocksGenerator *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs,string *filename)

{
  _Base_ptr *this_00;
  uint uVar1;
  cmGlobalGenerator *pcVar2;
  pointer pcVar3;
  cmSourceFile *this_01;
  iterator __position;
  _Alloc_hider __s1;
  size_type __n;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *pvVar4;
  bool bVar5;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  long lVar9;
  cmSystemTools *this_02;
  _Rb_tree_node_base *p_Var10;
  long *plVar11;
  size_t sVar12;
  ostream *poVar13;
  string *psVar14;
  vector<cmTarget_const*,std::allocator<cmTarget_const*>> *this_03;
  pointer ppcVar15;
  cmMakefile *pcVar16;
  iterator iVar17;
  mapped_type *__x;
  mapped_type *this_04;
  size_type *psVar18;
  pointer ppcVar19;
  pointer pbVar20;
  _Hash_node_base *p_Var21;
  undefined8 uVar22;
  cmTarget *pcVar23;
  pointer ppcVar24;
  cmMakefile *pcVar25;
  _Base_ptr p_Var26;
  pointer pbVar27;
  string fullPath;
  all_files_map_t allFiles;
  string lang;
  string compiler;
  string unitFiles;
  string virtualFolders;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cFiles;
  string make;
  Tree tree;
  cmGeneratedFileStream fout;
  string local_428;
  undefined1 local_408 [32];
  _Rb_tree_node_base *local_3e8;
  size_t local_3e0;
  string local_3d8;
  cmTarget *local_3b8;
  cmMakefile *local_3b0;
  undefined1 local_3a8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *local_368;
  cmMakefile *local_360;
  string local_358;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_338;
  cmTarget *local_320;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_318;
  long *local_2f8 [2];
  long local_2e8 [2];
  pointer local_2d8;
  cmMakefile *local_2d0;
  Tree local_2c8;
  undefined1 local_278 [584];
  
  pcVar16 = (*(lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
              _M_impl.super__Vector_impl_data._M_start)->Makefile;
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_278,(filename->_M_dataplus)._M_p,false);
  if (((byte)(*(_func_int **)(local_278._0_8_ + -0x18))[(long)(local_278 + 0x20)] & 5) == 0) {
    local_2c8.path._M_dataplus._M_p = (pointer)&local_2c8.path.field_2;
    local_2c8.path._M_string_length = 0;
    local_2c8.path.field_2._M_local_buf[0] = '\0';
    local_2c8.folders.super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_2c8.folders.super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2c8.folders.super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2c8.files.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2c8.files.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2c8.files.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pcVar2 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
    p_Var10 = (pcVar2->ProjectMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_3b8 = (cmTarget *)this;
    local_3b0 = pcVar16;
    local_368 = lgs;
    if ((_Rb_tree_header *)p_Var10 != &(pcVar2->ProjectMap)._M_t._M_impl.super__Rb_tree_header) {
      do {
        local_388._M_allocated_capacity = 0;
        local_388._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_378._M_allocated_capacity = 0;
        p_Var26 = *(_Base_ptr *)(p_Var10 + 2);
        if (p_Var26 != p_Var10[2]._M_parent) {
          do {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_388,local_388._8_8_,
                       *(undefined8 *)(*(long *)(*(long *)p_Var26 + 0x28) + 0x188),
                       *(undefined8 *)(*(long *)(*(long *)p_Var26 + 0x28) + 400));
            p_Var26 = (_Base_ptr)&p_Var26->_M_parent;
          } while (p_Var26 != p_Var10[2]._M_parent);
        }
        local_408._0_8_ = local_408 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"CMAKE_ROOT","");
        pcVar7 = cmMakefile::GetDefinition(local_3b0,(string *)local_408);
        uVar22 = local_388._M_allocated_capacity;
        if ((undefined1 *)local_408._0_8_ != local_408 + 0x10) {
          operator_delete((void *)local_408._0_8_,local_408._16_8_ + 1);
          uVar22 = local_388._M_allocated_capacity;
        }
        for (; uVar22 != local_388._8_8_;
            uVar22 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(uVar22 + 0x20)) {
          pcVar8 = (char *)strlen(pcVar7);
          lVar9 = std::__cxx11::string::find((char *)uVar22,(ulong)pcVar7,0);
          if (lVar9 != 0) {
            this_02 = (cmSystemTools *)
                      cmMakefile::GetHomeDirectory
                                (*(cmMakefile **)(**(long **)(p_Var10 + 2) + 0x28));
            cmSystemTools::RelativePath_abi_cxx11_
                      ((string *)local_408,this_02,*(char **)uVar22,pcVar8);
            local_3a8._0_8_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            local_3a8._8_8_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            local_3a8._16_8_ = (pointer)0x0;
            cmsys::SystemTools::SplitPath
                      ((string *)local_408,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_3a8,false);
            pcVar3 = (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_3a8._8_8_ + -0x20))->_M_dataplus)._M_p;
            local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_358,pcVar3,
                       pcVar3 + ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(local_3a8._8_8_ + -0x20))->_M_string_length);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::_M_erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_3a8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_3a8._8_8_ + -0x20),(iterator)local_3a8._8_8_);
            if ((local_3a8._8_8_ != local_3a8._0_8_) &&
               (lVar9 = std::__cxx11::string::find((char *)local_408,0x4a9c9a,0), lVar9 == -1)) {
              Tree::InsertPath(&local_2c8,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_3a8,1,&local_358);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_358._M_dataplus._M_p != &local_358.field_2) {
              operator_delete(local_358._M_dataplus._M_p,
                              CONCAT71(local_358.field_2._M_allocated_capacity._1_7_,
                                       local_358.field_2._M_local_buf[0]) + 1);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_3a8);
            if ((undefined1 *)local_408._0_8_ != local_408 + 0x10) {
              operator_delete((void *)local_408._0_8_,local_408._16_8_ + 1);
            }
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_388);
        p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
      } while (p_Var10 !=
               (local_3b8->Properties).
               super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
               ._M_t._M_impl.super__Rb_tree_header._M_header._M_right + 5);
    }
    pcVar23 = local_3b8;
    local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
    local_358._M_string_length = 0;
    local_358.field_2._M_local_buf[0] = '\0';
    Tree::BuildVirtualFolder(&local_2c8,&local_358);
    pcVar16 = local_3b0;
    local_388._M_allocated_capacity = (size_type)&local_378;
    local_388._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_378._M_allocated_capacity = local_378._M_allocated_capacity & 0xffffffffffffff00;
    pcVar7 = cmMakefile::GetHomeDirectory(local_3b0);
    std::__cxx11::string::string((string *)local_3a8,pcVar7,(allocator *)local_2f8);
    plVar11 = (long *)std::__cxx11::string::append(local_3a8);
    pcVar3 = local_408 + 0x10;
    psVar18 = (size_type *)(plVar11 + 2);
    if ((size_type *)*plVar11 == psVar18) {
      local_408._16_8_ = *psVar18;
      local_408._24_8_ = plVar11[3];
      local_408._0_8_ = pcVar3;
    }
    else {
      local_408._16_8_ = *psVar18;
      local_408._0_8_ = (size_type *)*plVar11;
    }
    local_408._8_8_ = plVar11[1];
    *plVar11 = (long)psVar18;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    Tree::BuildUnit(&local_2c8,(string *)&local_388,(string *)local_408);
    if ((pointer)local_408._0_8_ != pcVar3) {
      operator_delete((void *)local_408._0_8_,local_408._16_8_ + 1);
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a8._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_3a8 + 0x10)) {
      operator_delete((void *)local_3a8._0_8_,(ulong)(local_3a8._16_8_ + 1));
    }
    GetCBCompilerId_abi_cxx11_((string *)local_3a8,(cmExtraCodeBlocksGenerator *)pcVar23,pcVar16);
    local_408._0_8_ = pcVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"CMAKE_MAKE_PROGRAM","");
    pcVar7 = cmMakefile::GetRequiredDefinition(pcVar16,(string *)local_408);
    std::__cxx11::string::string((string *)local_2f8,pcVar7,(allocator *)&local_3d8);
    if ((pointer)local_408._0_8_ != pcVar3) {
      operator_delete((void *)local_408._0_8_,local_408._16_8_ + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,
               "<?xml version=\"1.0\" encoding=\"UTF-8\" standalone=\"yes\" ?>\n<CodeBlocks_project_file>\n   <FileVersion major=\"1\" minor=\"6\" />\n   <Project>\n      <Option title=\""
               ,0x9c);
    pcVar7 = (pcVar16->ProjectName)._M_dataplus._M_p;
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)(&stack0xfffffffffffffbc8 +
                           (long)*(_func_int **)(local_278._0_8_ + -0x18)) + 0x1c0);
    }
    else {
      sVar12 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,pcVar7,sVar12);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,
               "\" />\n      <Option makefile_is_custom=\"1\" />\n      <Option compiler=\"",0x45);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_278,(char *)local_3a8._0_8_,local_3a8._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\" />\n      ",0xb);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar13,local_358._M_dataplus._M_p,local_358._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n      <Build>\n",0xf);
    local_408._0_8_ = pcVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"all","");
    pvVar4 = local_368;
    AppendTarget((cmExtraCodeBlocksGenerator *)pcVar23,(cmGeneratedFileStream *)local_278,
                 (string *)local_408,(cmTarget *)0x0,(char *)local_2f8[0],
                 *(local_368->
                  super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
                  _M_impl.super__Vector_impl_data._M_start,(char *)local_3a8._0_8_);
    if ((pointer)local_408._0_8_ != pcVar3) {
      operator_delete((void *)local_408._0_8_,local_408._16_8_ + 1);
    }
    ppcVar19 = (pvVar4->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)
               ._M_impl.super__Vector_impl_data._M_start;
    ppcVar15 = (pvVar4->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)
               ._M_impl.super__Vector_impl_data._M_finish;
    if (ppcVar19 != ppcVar15) {
      do {
        local_360 = (*ppcVar19)->Makefile;
        p_Var21 = (local_360->Targets)._M_h._M_before_begin._M_nxt;
        if (p_Var21 != (_Hash_node_base *)0x0) {
          do {
            psVar14 = (string *)(p_Var21 + 1);
            uVar1 = *(uint *)&p_Var21[0x61]._M_nxt;
            if (uVar1 < 5) {
              AppendTarget((cmExtraCodeBlocksGenerator *)local_3b8,
                           (cmGeneratedFileStream *)local_278,psVar14,(cmTarget *)(p_Var21 + 5),
                           (char *)local_2f8[0],*ppcVar19,(char *)local_3a8._0_8_);
              local_408._0_8_ = local_408 + 0x10;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_408,p_Var21[1]._M_nxt,
                         (long)&(p_Var21[1]._M_nxt)->_M_nxt + (long)&(p_Var21[2]._M_nxt)->_M_nxt);
              std::__cxx11::string::append((char *)local_408);
              AppendTarget((cmExtraCodeBlocksGenerator *)local_3b8,
                           (cmGeneratedFileStream *)local_278,(string *)local_408,
                           (cmTarget *)(p_Var21 + 5),(char *)local_2f8[0],*ppcVar19,
                           (char *)local_3a8._0_8_);
              if ((undefined1 *)local_408._0_8_ != local_408 + 0x10) {
                operator_delete((void *)local_408._0_8_,local_408._16_8_ + 1);
              }
            }
            else if (uVar1 == 5) {
              lVar9 = std::__cxx11::string::find((char *)psVar14,0x4c7b48,0);
              if (((lVar9 != 0) ||
                  (iVar6 = std::__cxx11::string::compare((char *)psVar14), iVar6 == 0)) &&
                 ((lVar9 = std::__cxx11::string::find((char *)psVar14,0x4c7b50,0), lVar9 != 0 ||
                  (iVar6 = std::__cxx11::string::compare((char *)psVar14), iVar6 == 0)))) {
                lVar9 = std::__cxx11::string::find((char *)psVar14,0x4c7b5b,0);
                if (lVar9 == 0) {
                  iVar6 = std::__cxx11::string::compare((char *)psVar14);
                  goto LAB_0036e918;
                }
LAB_0036e973:
                AppendTarget((cmExtraCodeBlocksGenerator *)local_3b8,
                             (cmGeneratedFileStream *)local_278,psVar14,(cmTarget *)0x0,
                             (char *)local_2f8[0],*ppcVar19,(char *)local_3a8._0_8_);
              }
            }
            else if (uVar1 == 6) {
              pcVar7 = cmMakefile::GetCurrentBinaryDirectory(local_360);
              pcVar8 = cmMakefile::GetHomeOutputDirectory(local_360);
              iVar6 = strcmp(pcVar7,pcVar8);
LAB_0036e918:
              if (iVar6 == 0) goto LAB_0036e973;
            }
            p_Var21 = p_Var21->_M_nxt;
          } while (p_Var21 != (_Hash_node_base *)0x0);
          ppcVar15 = (local_368->
                     super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
        }
        ppcVar19 = ppcVar19 + 1;
      } while (ppcVar19 != ppcVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"      </Build>\n",0xf);
    local_408._24_8_ = local_408 + 8;
    local_408._8_8_ = local_408._8_8_ & 0xffffffff00000000;
    local_408._16_8_ = 0;
    local_3e0 = 0;
    local_318.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_318.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
    local_318.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
    ppcVar19 = (local_368->
               super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
               super__Vector_impl_data._M_start;
    ppcVar15 = (local_368->
               super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    pcVar16 = local_3b0;
    local_3e8 = (_Rb_tree_node_base *)local_408._24_8_;
    if (ppcVar19 != ppcVar15) {
      do {
        local_2d0 = (*ppcVar19)->Makefile;
        pcVar25 = (cmMakefile *)(local_2d0->Targets)._M_h._M_before_begin._M_nxt;
        local_2d8 = ppcVar19;
        if (pcVar25 != (cmMakefile *)0x0) {
          do {
            if (*(uint *)&(pcVar25->SourceGroups).
                          super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage < 6) {
              local_338.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_338.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_338.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_428,"CMAKE_BUILD_TYPE","");
              pcVar7 = cmMakefile::GetSafeDefinition(local_2d0,&local_428);
              std::__cxx11::string::string((string *)&local_3d8,pcVar7,(allocator *)&local_320);
              this_00 = &(pcVar25->CMP0054ReportedIds)._M_t._M_impl.super__Rb_tree_header._M_header.
                         _M_right;
              cmTarget::GetSourceFiles((cmTarget *)this_00,&local_338,&local_3d8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
                operator_delete(local_3d8._M_dataplus._M_p,
                                local_3d8.field_2._M_allocated_capacity + 1);
              }
              local_360 = pcVar25;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_428._M_dataplus._M_p != &local_428.field_2) {
                operator_delete(local_428._M_dataplus._M_p,
                                local_428.field_2._M_allocated_capacity + 1);
              }
              ppcVar24 = local_338.
                         super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl
                         .super__Vector_impl_data._M_start;
              local_3b8 = (cmTarget *)this_00;
              if (local_338.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_start !=
                  local_338.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
                do {
                  this_01 = *ppcVar24;
                  local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_3d8,"GENERATED","");
                  bVar5 = cmSourceFile::GetPropertyAsBool(this_01,&local_3d8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
                    operator_delete(local_3d8._M_dataplus._M_p,
                                    local_3d8.field_2._M_allocated_capacity + 1);
                  }
                  pcVar23 = local_3b8;
                  if (!bVar5) {
                    cmSourceFile::GetLanguage_abi_cxx11_(&local_3d8,*ppcVar24);
                    iVar6 = std::__cxx11::string::compare((char *)&local_3d8);
                    if ((iVar6 == 0) ||
                       (iVar6 = std::__cxx11::string::compare((char *)&local_3d8), iVar6 == 0)) {
                      psVar14 = cmSourceFile::GetExtension_abi_cxx11_(*ppcVar24);
                      local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
                      pcVar3 = (psVar14->_M_dataplus)._M_p;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_428,pcVar3,pcVar3 + psVar14->_M_string_length);
                      __n = local_428._M_string_length;
                      __s1._M_p = local_428._M_dataplus._M_p;
                      pbVar27 = (pcVar16->SourceFileExtensions).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
                      for (pbVar20 = (pcVar16->SourceFileExtensions).
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start; pbVar20 != pbVar27;
                          pbVar20 = pbVar20 + 1) {
                        if ((__n == pbVar20->_M_string_length) &&
                           ((bVar5 = true, __n == 0 ||
                            (iVar6 = bcmp(__s1._M_p,(pbVar20->_M_dataplus)._M_p,__n), iVar6 == 0))))
                        goto LAB_0036ec74;
                      }
                      bVar5 = false;
LAB_0036ec74:
                      pcVar23 = local_3b8;
                      pcVar16 = local_3b0;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)__s1._M_p != &local_428.field_2) {
                        operator_delete(__s1._M_p,local_428.field_2._M_allocated_capacity + 1);
                        pcVar23 = local_3b8;
                        pcVar16 = local_3b0;
                      }
                    }
                    else {
                      bVar5 = false;
                    }
                    psVar14 = cmSourceFile::GetFullPath(*ppcVar24,(string *)0x0);
                    local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
                    pcVar3 = (psVar14->_M_dataplus)._M_p;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_428,pcVar3,pcVar3 + psVar14->_M_string_length);
                    if (bVar5) {
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::push_back(&local_318,&local_428);
                    }
                    this_03 = (vector<cmTarget_const*,std::allocator<cmTarget_const*>> *)
                              std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                                            *)local_408,&local_428);
                    __position._M_current = *(cmTarget ***)(this_03 + 8);
                    local_320 = pcVar23;
                    if (__position._M_current == *(cmTarget ***)(this_03 + 0x10)) {
                      std::vector<cmTarget_const*,std::allocator<cmTarget_const*>>::
                      _M_realloc_insert<cmTarget_const*>(this_03,__position,&local_320);
                    }
                    else {
                      *__position._M_current = pcVar23;
                      *(long *)(this_03 + 8) = *(long *)(this_03 + 8) + 8;
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_428._M_dataplus._M_p != &local_428.field_2) {
                      operator_delete(local_428._M_dataplus._M_p,
                                      local_428.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
                      operator_delete(local_3d8._M_dataplus._M_p,
                                      local_3d8.field_2._M_allocated_capacity + 1);
                    }
                  }
                  ppcVar24 = ppcVar24 + 1;
                } while (ppcVar24 !=
                         local_338.
                         super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl
                         .super__Vector_impl_data._M_finish);
              }
              pcVar25 = local_360;
              if (local_338.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_338.
                                super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_338.
                                      super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_338.
                                      super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
                pcVar25 = local_360;
              }
            }
            pcVar25 = (cmMakefile *)(pcVar25->Internal).x_;
          } while (pcVar25 != (cmMakefile *)0x0);
          ppcVar15 = (local_368->
                     super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
        }
        ppcVar19 = local_2d8 + 1;
      } while (ppcVar19 != ppcVar15);
      if (local_318.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_318.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pbVar20 = local_318.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          cmsys::SystemTools::GetFilenamePath(&local_3d8,pbVar20);
          std::__cxx11::string::append((char *)&local_3d8);
          cmsys::SystemTools::GetFilenameWithoutExtension(&local_428,pbVar20);
          std::__cxx11::string::_M_append((char *)&local_3d8,(ulong)local_428._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_428._M_dataplus._M_p != &local_428.field_2) {
            operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
          }
          pbVar27 = (pcVar16->HeaderFileExtensions).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          for (; pbVar27 !=
                 (pcVar16->HeaderFileExtensions).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish; pbVar27 = pbVar27 + 1) {
            local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_428,local_3d8._M_dataplus._M_p,
                       local_3d8._M_dataplus._M_p + local_3d8._M_string_length);
            std::__cxx11::string::append((char *)&local_428);
            std::__cxx11::string::_M_append((char *)&local_428,(ulong)(pbVar27->_M_dataplus)._M_p);
            iVar17 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                             *)local_408,&local_428);
            if (iVar17._M_node != (_Base_ptr)(local_408 + 8)) {
LAB_0036ef03:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_428._M_dataplus._M_p != &local_428.field_2) {
                operator_delete(local_428._M_dataplus._M_p,
                                local_428.field_2._M_allocated_capacity + 1);
              }
              break;
            }
            bVar5 = cmsys::SystemTools::FileExists(local_428._M_dataplus._M_p);
            if (bVar5) {
              __x = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                                  *)local_408,pbVar20);
              this_04 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                                      *)local_408,&local_428);
              std::vector<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>::operator=
                        (&this_04->Targets,&__x->Targets);
              goto LAB_0036ef03;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_428._M_dataplus._M_p != &local_428.field_2) {
              operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1
                             );
            }
            pcVar16 = local_3b0;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
            operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
          }
          pbVar20 = pbVar20 + 1;
          pcVar16 = local_3b0;
        } while (pbVar20 !=
                 local_318.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
    }
    if ((_Rb_tree_node_base *)local_408._24_8_ != (_Rb_tree_node_base *)(local_408 + 8)) {
      p_Var10 = (_Rb_tree_node_base *)local_408._24_8_;
      do {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_278,"      <Unit filename=\"",0x16);
        cmXMLSafe::cmXMLSafe((cmXMLSafe *)&local_3d8,(string *)(p_Var10 + 1));
        poVar13 = operator<<((ostream *)local_278,(cmXMLSafe *)&local_3d8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\">\n",3);
        for (p_Var26 = *(_Base_ptr *)(p_Var10 + 2); p_Var26 != p_Var10[2]._M_parent;
            p_Var26 = (_Base_ptr)&p_Var26->_M_parent) {
          lVar9 = *(long *)p_Var26;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_278,"         <Option target=\"",0x19);
          cmXMLSafe::cmXMLSafe((cmXMLSafe *)&local_3d8,(string *)(lVar9 + 0x1a8));
          poVar13 = operator<<((ostream *)local_278,(cmXMLSafe *)&local_3d8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\"/>\n",4);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_278,"      </Unit>\n",0xe);
        p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
      } while (p_Var10 != (_Rb_tree_node_base *)(local_408 + 8));
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,(char *)local_388._M_allocated_capacity,local_388._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,"   </Project>\n</CodeBlocks_project_file>\n",0x29);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_318);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                 *)local_408);
    if (local_2f8[0] != local_2e8) {
      operator_delete(local_2f8[0],local_2e8[0] + 1);
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a8._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_3a8 + 0x10)) {
      operator_delete((void *)local_3a8._0_8_,(ulong)(local_3a8._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._M_allocated_capacity != &local_378) {
      operator_delete((void *)local_388._M_allocated_capacity,local_378._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_dataplus._M_p != &local_358.field_2) {
      operator_delete(local_358._M_dataplus._M_p,
                      CONCAT71(local_358.field_2._M_allocated_capacity._1_7_,
                               local_358.field_2._M_local_buf[0]) + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2c8.files);
    std::vector<Tree,_std::allocator<Tree>_>::~vector(&local_2c8.folders);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8.path._M_dataplus._M_p != &local_2c8.path.field_2) {
      operator_delete(local_2c8.path._M_dataplus._M_p,
                      CONCAT71(local_2c8.path.field_2._M_allocated_capacity._1_7_,
                               local_2c8.path.field_2._M_local_buf[0]) + 1);
    }
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
  return;
}

Assistant:

void cmExtraCodeBlocksGenerator
  ::CreateNewProjectFile(const std::vector<cmLocalGenerator*>& lgs,
                         const std::string& filename)
{
  const cmMakefile* mf=lgs[0]->GetMakefile();
  cmGeneratedFileStream fout(filename.c_str());
  if(!fout)
    {
    return;
    }

  Tree tree;

  // build tree of virtual folders
  for (std::map<std::string, std::vector<cmLocalGenerator*> >::const_iterator
          it = this->GlobalGenerator->GetProjectMap().begin();
         it != this->GlobalGenerator->GetProjectMap().end();
         ++it)
    {
    // Collect all files
    std::vector<std::string> listFiles;
    for (std::vector<cmLocalGenerator *>::const_iterator
         jt = it->second.begin();
         jt != it->second.end();
         ++jt)
      {
      const std::vector<std::string> & files =
                                          (*jt)->GetMakefile()->GetListFiles();
      listFiles.insert(listFiles.end(), files.begin(), files.end());
      }

    // Convert
    const char* cmakeRoot = mf->GetDefinition("CMAKE_ROOT");
    for (std::vector<std::string>::const_iterator jt = listFiles.begin();
         jt != listFiles.end();
         ++jt)
      {
      // don't put cmake's own files into the project (#12110):
      if (jt->find(cmakeRoot) == 0)
        {
        continue;
        }

      const std::string &relative = cmSystemTools::RelativePath(
                         it->second[0]->GetMakefile()->GetHomeDirectory(),
                         jt->c_str());
      std::vector<std::string> splitted;
      cmSystemTools::SplitPath(relative, splitted, false);
      // Split filename from path
      std::string fileName = *(splitted.end()-1);
      splitted.erase(splitted.end() - 1, splitted.end());

      // We don't want paths with CMakeFiles in them
      // or do we?
      // In speedcrunch those where purely internal
      if (splitted.size() >= 1
          && relative.find("CMakeFiles") == std::string::npos)
        {
        tree.InsertPath(splitted, 1, fileName);
        }
      }
    }

  // Now build a virtual tree string
  std::string virtualFolders;
  tree.BuildVirtualFolder(virtualFolders);
  // And one for <Unit>
  std::string unitFiles;
  tree.BuildUnit(unitFiles, std::string(mf->GetHomeDirectory()) + "/");

  // figure out the compiler
  std::string compiler = this->GetCBCompilerId(mf);
  std::string make = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");

  fout<<"<?xml version=\"1.0\" encoding=\"UTF-8\" standalone=\"yes\" ?>\n"
        "<CodeBlocks_project_file>\n"
        "   <FileVersion major=\"1\" minor=\"6\" />\n"
        "   <Project>\n"
        "      <Option title=\"" << mf->GetProjectName()<<"\" />\n"
        "      <Option makefile_is_custom=\"1\" />\n"
        "      <Option compiler=\"" << compiler << "\" />\n"
        "      "<<virtualFolders<<"\n"
        "      <Build>\n";

  this->AppendTarget(fout, "all", 0, make.c_str(), lgs[0], compiler.c_str());

  // add all executable and library targets and some of the GLOBAL
  // and UTILITY targets
  for (std::vector<cmLocalGenerator*>::const_iterator lg=lgs.begin();
       lg!=lgs.end(); lg++)
    {
    cmMakefile* makefile=(*lg)->GetMakefile();
    cmTargets& targets=makefile->GetTargets();
    for (cmTargets::iterator ti = targets.begin();
         ti != targets.end(); ti++)
      {
      switch(ti->second.GetType())
        {
        case cmTarget::GLOBAL_TARGET:
          {
          // Only add the global targets from CMAKE_BINARY_DIR,
          // not from the subdirs
          if (strcmp(makefile->GetCurrentBinaryDirectory(),
                     makefile->GetHomeOutputDirectory())==0)
            {
            this->AppendTarget(fout, ti->first, 0,
                               make.c_str(), *lg, compiler.c_str());
            }
          }
          break;
        case cmTarget::UTILITY:
          // Add all utility targets, except the Nightly/Continuous/
          // Experimental-"sub"targets as e.g. NightlyStart
          if (((ti->first.find("Nightly")==0)   &&(ti->first!="Nightly"))
             || ((ti->first.find("Continuous")==0)&&(ti->first!="Continuous"))
             || ((ti->first.find("Experimental")==0)
                                               && (ti->first!="Experimental")))
            {
            break;
            }

          this->AppendTarget(fout, ti->first, 0,
                                 make.c_str(), *lg, compiler.c_str());
          break;
        case cmTarget::EXECUTABLE:
        case cmTarget::STATIC_LIBRARY:
        case cmTarget::SHARED_LIBRARY:
        case cmTarget::MODULE_LIBRARY:
        case cmTarget::OBJECT_LIBRARY:
          {
          this->AppendTarget(fout, ti->first, &ti->second,
                             make.c_str(), *lg, compiler.c_str());
          std::string fastTarget = ti->first;
          fastTarget += "/fast";
          this->AppendTarget(fout, fastTarget, &ti->second,
                             make.c_str(), *lg, compiler.c_str());
          }
          break;
        default:
          break;
        }
      }
    }

  fout<<"      </Build>\n";


  // Collect all used source files in the project.
  // Keep a list of C/C++ source files which might have an acompanying header
  // that should be looked for.
  typedef std::map<std::string, CbpUnit> all_files_map_t;
  all_files_map_t allFiles;
  std::vector<std::string> cFiles;

  for (std::vector<cmLocalGenerator*>::const_iterator lg=lgs.begin();
       lg!=lgs.end(); lg++)
    {
    cmMakefile* makefile=(*lg)->GetMakefile();
    cmTargets& targets=makefile->GetTargets();
    for (cmTargets::iterator ti = targets.begin();
         ti != targets.end(); ti++)
      {
      switch(ti->second.GetType())
        {
        case cmTarget::EXECUTABLE:
        case cmTarget::STATIC_LIBRARY:
        case cmTarget::SHARED_LIBRARY:
        case cmTarget::MODULE_LIBRARY:
        case cmTarget::OBJECT_LIBRARY:
        case cmTarget::UTILITY: // can have sources since 2.6.3
          {
          std::vector<cmSourceFile*> sources;
          ti->second.GetSourceFiles(sources,
                            makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
          for (std::vector<cmSourceFile*>::const_iterator si=sources.begin();
               si!=sources.end(); si++)
            {
            // don't add source files which have the GENERATED property set:
            if ((*si)->GetPropertyAsBool("GENERATED"))
              {
              continue;
              }

            // check whether it is a C/C++ implementation file
            bool isCFile = false;
            std::string lang = (*si)->GetLanguage();
            if (lang == "C" || lang == "CXX")
              {
              std::string srcext = (*si)->GetExtension();
              for(std::vector<std::string>::const_iterator
                  ext = mf->GetSourceExtensions().begin();
                  ext !=  mf->GetSourceExtensions().end();
                  ++ext)
                {
                if (srcext == *ext)
                  {
                  isCFile = true;
                  break;
                  }
                }
              }

            std::string fullPath = (*si)->GetFullPath();

            if(isCFile)
              {
              cFiles.push_back(fullPath);
              }

            CbpUnit &cbpUnit = allFiles[fullPath];
            cbpUnit.Targets.push_back(&(ti->second));
            }
          }
        default:  // intended fallthrough
          break;
        }
      }
    }

  // The following loop tries to add header files matching to implementation
  // files to the project. It does that by iterating over all
  // C/C++ source files,
  // replacing the file name extension with ".h" and checks whether such a
  // file exists. If it does, it is inserted into the map of files.
  // A very similar version of that code exists also in the kdevelop
  // project generator.
  for (std::vector<std::string>::const_iterator
       sit=cFiles.begin();
       sit!=cFiles.end();
       ++sit)
    {
    std::string const& fileName = *sit;
    std::string headerBasename=cmSystemTools::GetFilenamePath(fileName);
    headerBasename+="/";
    headerBasename+=cmSystemTools::GetFilenameWithoutExtension(fileName);

    // check if there's a matching header around
    for(std::vector<std::string>::const_iterator
        ext = mf->GetHeaderExtensions().begin();
        ext !=  mf->GetHeaderExtensions().end();
        ++ext)
      {
      std::string hname=headerBasename;
      hname += ".";
      hname += *ext;
      // if it's already in the set, don't check if it exists on disk
      if (allFiles.find(hname) != allFiles.end())
        {
        break;
        }

      if(cmSystemTools::FileExists(hname.c_str()))
        {
        allFiles[hname].Targets = allFiles[fileName].Targets;
        break;
        }
      }
    }

  // insert all source files in the CodeBlocks project
  for (all_files_map_t::const_iterator
       sit=allFiles.begin();
       sit!=allFiles.end();
       ++sit)
    {
    std::string const& unitFilename = sit->first;
    CbpUnit const& unit = sit->second;

    fout<<"      <Unit filename=\""<< cmXMLSafe(unitFilename) <<"\">\n";

    for(std::vector<const cmTarget*>::const_iterator ti = unit.Targets.begin();
      ti != unit.Targets.end(); ++ti)
      {
      std::string const& targetName = (*ti)->GetName();
      fout<<"         <Option target=\""<< cmXMLSafe(targetName) <<"\"/>\n";
      }

    fout<<"      </Unit>\n";
    }

  // Add CMakeLists.txt
  fout<<unitFiles;

  fout<<"   </Project>\n"
        "</CodeBlocks_project_file>\n";
}